

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall
adios2::core::Engine::DoGetDeferred(Engine *this,Variable<unsigned_int> *param_1,uint32_t *param_2)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"DoGetDeferred",&local_31);
  ThrowUp(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Engine::DoGetStructSync(VariableStruct &, void *) { ThrowUp("DoGetSync for Struct Variable"); }